

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ralocal_p.h
# Opt level: O0

Error __thiscall
asmjit::_abi_1_10::RALocalAllocator::onSaveReg
          (RALocalAllocator *this,RegGroup group,uint32_t workId,uint32_t physId)

{
  uint32_t uVar1;
  Error EVar2;
  uint32_t in_ECX;
  uint32_t in_EDX;
  undefined1 in_SIL;
  RAAssignment *in_RDI;
  char *in_stack_000003d0;
  int in_stack_000003dc;
  char *in_stack_000003e0;
  uint32_t in_stack_ffffffffffffffd8;
  RegGroup in_stack_ffffffffffffffdf;
  uint32_t in_stack_ffffffffffffffe8;
  undefined3 in_stack_fffffffffffffff4;
  undefined4 uVar3;
  
  uVar3 = CONCAT13(in_SIL,in_stack_fffffffffffffff4);
  uVar1 = RAAssignment::workToPhysId(in_RDI,in_stack_ffffffffffffffdf,in_stack_ffffffffffffffd8);
  if (uVar1 != in_ECX) {
    DebugUtils::assertionFailed(in_stack_000003e0,in_stack_000003dc,in_stack_000003d0);
  }
  uVar1 = RAAssignment::physToWorkId(in_RDI,in_stack_ffffffffffffffdf,in_stack_ffffffffffffffd8);
  if (uVar1 != in_EDX) {
    DebugUtils::assertionFailed(in_stack_000003e0,in_stack_000003dc,in_stack_000003d0);
  }
  RAAssignment::makeClean
            ((RAAssignment *)CONCAT44(uVar3,in_EDX),(RegGroup)(in_ECX >> 0x18),
             in_stack_ffffffffffffffe8,(uint32_t)((ulong)in_RDI >> 0x20));
  EVar2 = (**(code **)(**(long **)&in_RDI->_layout + 0x60))
                    (*(long **)&in_RDI->_layout,in_EDX,in_ECX);
  return EVar2;
}

Assistant:

inline Error onSaveReg(RegGroup group, uint32_t workId, uint32_t physId) noexcept {
    ASMJIT_ASSERT(_curAssignment.workToPhysId(group, workId) == physId);
    ASMJIT_ASSERT(_curAssignment.physToWorkId(group, physId) == workId);

    _curAssignment.makeClean(group, workId, physId);
    return _pass->emitSave(workId, physId);
  }